

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O1

void addToBucket(int buckIdx,int element)

{
  int iVar1;
  pointer piVar2;
  int old;
  
  piVar2 = bucket.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar1 = bucket.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[buckIdx];
  bucket.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [buckIdx] = element;
  if (iVar1 != -1) {
    piVar2[element] = iVar1;
  }
  return;
}

Assistant:

void addToBucket(int buckIdx, int element) {
	if (bucket[buckIdx] == -1) {
		bucket[buckIdx] = element;
	} else {
		const int old = bucket[buckIdx];
		bucket[buckIdx] = element;
		bucket[element] = old;
	}
}